

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
HdlcSimulationDataGenerator::CreateAsyncByte(HdlcSimulationDataGenerator *this,U8 byte)

{
  int iVar1;
  BitState BVar2;
  BitExtractor bit_extractor;
  BitExtractor aBStack_28 [8];
  
  BVar2 = (int)this + 0x48;
  iVar1 = SimulationChannelDescriptor::GetCurrentBitState();
  if (iVar1 == 0) {
    SimulationChannelDescriptor::Transition();
    SimulationChannelDescriptor::Advance(BVar2);
  }
  SimulationChannelDescriptor::TransitionIfNeeded(BVar2);
  SimulationChannelDescriptor::Advance(BVar2);
  iVar1 = 8;
  BitExtractor::BitExtractor(aBStack_28,(ulong)byte,LsbFirst,8);
  do {
    BitExtractor::GetNextBit();
    SimulationChannelDescriptor::TransitionIfNeeded(BVar2);
    SimulationChannelDescriptor::Advance(BVar2);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  SimulationChannelDescriptor::TransitionIfNeeded(BVar2);
  SimulationChannelDescriptor::Advance(BVar2);
  BitExtractor::~BitExtractor(aBStack_28);
  return;
}

Assistant:

void HdlcSimulationDataGenerator::CreateAsyncByte( U8 byte )
{
    // 0) If the line is not high we must set it high
    if( mHdlcSimulationData.GetCurrentBitState() == BIT_LOW )
    {
        mHdlcSimulationData.Transition();
        mHdlcSimulationData.Advance( mSamplesInHalfPeriod );
    }

    // 1) Start bit (BIT_HIGH -> BIT_LOW)
    mHdlcSimulationData.TransitionIfNeeded( BIT_LOW );
    mHdlcSimulationData.Advance( mSamplesInHalfPeriod );

    // 2) Transmit byte
    BitExtractor bit_extractor( byte, AnalyzerEnums::LsbFirst, 8 );
    for( U32 i = 0; i < 8; ++i )
    {
        BitState bit = bit_extractor.GetNextBit();
        mHdlcSimulationData.TransitionIfNeeded( bit );
        mHdlcSimulationData.Advance( mSamplesInHalfPeriod );
    }

    // 3) Stop bit (BIT_LOW -> BIT_HIGH)
    mHdlcSimulationData.TransitionIfNeeded( BIT_HIGH );
    mHdlcSimulationData.Advance( mSamplesInHalfPeriod );
}